

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int RebootSeanet(SEANET *pSeanet)

{
  int iVar1;
  int iVar2;
  char *__s;
  double dVar3;
  int nbdatabytes;
  uchar databuf [22];
  uchar reqbuf [14];
  CHRONO chrono;
  
  reqbuf[8] = '\x02';
  reqbuf[9] = '\x03';
  reqbuf[10] = '\x10';
  reqbuf[0xb] = 0x80;
  reqbuf[0xc] = '\x02';
  reqbuf[0xd] = '\n';
  builtin_memcpy(reqbuf,"@0008\b",7);
  reqbuf[7] = 0xff;
  nbdatabytes = 0;
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,reqbuf,0xe);
  iVar2 = 1;
  if (iVar1 == 0) {
    mSleep(1000);
    StartChrono(&chrono);
    do {
      dVar3 = GetTimeElapsedChronoQuick(&chrono);
      if (30.0 < dVar3) {
        iVar2 = 2;
        __s = "Error reading data from a Seanet : Reboot timeout. ";
        goto LAB_00172576;
      }
      databuf[0] = '\0';
      databuf[1] = '\0';
      databuf[2] = '\0';
      databuf[3] = '\0';
      databuf[4] = '\0';
      databuf[5] = '\0';
      databuf[6] = '\0';
      databuf[7] = '\0';
      databuf[8] = '\0';
      databuf[9] = '\0';
      databuf[10] = '\0';
      databuf[0xb] = '\0';
      databuf[0xc] = '\0';
      databuf[0xd] = '\0';
      databuf[0xe] = '\0';
      databuf[0xf] = '\0';
      databuf[0x10] = '\0';
      databuf[0x11] = '\0';
      databuf[0x12] = '\0';
      databuf[0x13] = '\0';
      databuf[0x14] = '\0';
      databuf[0x15] = '\0';
      nbdatabytes = 0;
      iVar2 = GetLatestMsgSeanet(pSeanet,4,databuf,0x16,&nbdatabytes);
      if (iVar2 != 0) {
        __s = "A Seanet is not responding correctly. ";
        iVar2 = 1;
        goto LAB_00172576;
      }
      pSeanet->HeadInf = (uint)databuf[0x14];
    } while ((char)databuf[0x14] < '\0' || (databuf[0x14] & 6) != 2);
    iVar2 = 0;
  }
  else {
    __s = "Error writing data to a Seanet. ";
LAB_00172576:
    puts(__s);
  }
  return iVar2;
}

Assistant:

inline int RebootSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtReboot,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[22];
	int nbdatabytes = 0;
	CHRONO chrono;

	// Send mtReboot message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	mSleep(1000); // Wait for the device to reboot.

	StartChrono(&chrono);

	// Check mtAlive message HeadInf byte with Transducer Centred (bit 1=1), not Motoring (bit 2=0), not SentCfg (bit 7=0).
	do
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_REBOOT_SEANET)
		{
			printf("Error reading data from a Seanet : Reboot timeout. \n");
			return EXIT_TIMEOUT;
		}

		// Wait for a mtAlive message. It should come every 1 second.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// HeadInf.
		pSeanet->HeadInf = (unsigned char)databuf[20];

		//printf("mtAlive message databuf[20]=%#x\n", (int)databuf[20]);
	}
	while (!(databuf[20]&0x02)||(databuf[20]&0x04)||(databuf[20]&0x80));

	return EXIT_SUCCESS;
}